

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu_bar.cpp
# Opt level: O2

Am_Value menu_bar_copy_item_to_command_proc(Am_Object *self)

{
  bool bVar1;
  Am_Value_Type AVar2;
  int iVar3;
  Am_Value *pAVar4;
  ostream *poVar5;
  anon_union_8_8_ea4c8939_for_value extraout_RDX;
  anon_union_8_8_ea4c8939_for_value extraout_RDX_00;
  anon_union_8_8_ea4c8939_for_value aVar6;
  Am_Object *in_RSI;
  Am_Value AVar7;
  Am_Object local_40;
  Am_Object local_38;
  Am_Object local_30;
  Am_Object local_28;
  
  *(undefined2 *)&self->data = 0;
  self[1].data = (Am_Object_Data *)0x0;
  pAVar4 = Am_Object::Get(in_RSI,0xa3,1);
  Am_Value::operator=((Am_Value *)self,pAVar4);
  if (*(short *)&self->data == -0x5fff) {
    Am_Object::Am_Object(&local_40,(Am_Value *)self);
    bVar1 = Am_Object::Valid(&local_40);
    if (bVar1) {
      Am_Object::Am_Object(&local_28,(Am_Value *)self);
      Am_Object::Am_Object(&local_30,&Am_Command);
      bVar1 = Am_Object::Is_Instance_Of(&local_28,&local_30);
      Am_Object::~Am_Object(&local_30);
      Am_Object::~Am_Object(&local_28);
      Am_Object::~Am_Object(&local_40);
      if (bVar1) {
        copy_item_to_command_proc(in_RSI,(Am_Value *)self);
        AVar2 = Am_Object::Get_Slot_Type(in_RSI,0x1d2,0);
        aVar6 = extraout_RDX;
        if (AVar2 != 0xa001) {
          Am_Object::Am_Object(&local_38,in_RSI);
          create_sub_menu_window(&local_38);
          Am_Object::~Am_Object(&local_38);
          aVar6 = extraout_RDX_00;
        }
        AVar7.value.wrapper_value = aVar6.wrapper_value;
        AVar7._0_8_ = self;
        return AVar7;
      }
    }
    else {
      Am_Object::~Am_Object(&local_40);
    }
  }
  poVar5 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
  poVar5 = std::operator<<(poVar5,
                           "In a menu_bar, the top-level items must be\ncommand objects, but for ");
  poVar5 = operator<<(poVar5,in_RSI);
  poVar5 = std::operator<<(poVar5," item # ");
  pAVar4 = Am_Object::Get(in_RSI,0x85,0);
  iVar3 = Am_Value::operator_cast_to_int(pAVar4);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3 + 1);
  poVar5 = std::operator<<(poVar5," is ");
  poVar5 = operator<<(poVar5,(Am_Value *)self);
  std::endl<char,std::char_traits<char>>(poVar5);
  Am_Error();
}

Assistant:

Am_Define_Formula(Am_Value, menu_bar_copy_item_to_command)
{
  Am_Value value;
  value = self.Peek(Am_ITEM);
  //if (!value.Exists()) return 0;
  if (value.type == Am_OBJECT && Am_Object(value).Valid() &&
      Am_Object(value).Is_Instance_Of(Am_Command)) {
    //then fine
  } else {
    Am_ERRORO(
        "In a menu_bar, the top-level items must be\ncommand objects, but for "
            << self << " item # " << (int)self.Get(Am_RANK) + 1 << " is "
            << value,
        self, Am_ITEM);
  }

  copy_item_to_command_proc(self, value);

  //now create the sub-menu if necessary
  if (self.Get_Slot_Type(Am_SUB_MENU) != Am_OBJECT) {
    create_sub_menu_window(self);
  }

  return (value);
}